

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitGetAsyncIterator
               (RegSlot resultReg,RegSlot iterableReg,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  ByteCodeLabel noMethodLabel;
  ByteCodeLabel labelID;
  RegSlot iteratorReg;
  
  this = &byteCodeGenerator->m_writer;
  noMethodLabel = Js::ByteCodeWriter::DefineLabel(this);
  EmitGetOptionalObjectMethod(resultReg,iterableReg,0x11,noMethodLabel,byteCodeGenerator,funcInfo);
  EmitFunctionCall(resultReg,resultReg,iterableReg,byteCodeGenerator,funcInfo);
  EmitThrowOnNotObject(resultReg,byteCodeGenerator);
  labelID = Js::ByteCodeWriter::DefineLabel(this);
  Js::ByteCodeWriter::Br(this,labelID);
  Js::ByteCodeWriter::MarkLabel(this,noMethodLabel);
  iteratorReg = FuncInfo::AcquireTmpRegister(funcInfo);
  EmitGetIterator(iteratorReg,iterableReg,byteCodeGenerator,funcInfo);
  Js::ByteCodeWriter::Reg2(this,NewAsyncFromSyncIterator,iteratorReg,iteratorReg);
  Js::ByteCodeWriter::Reg2(this,Ld_A_ReuseLoc,resultReg,iteratorReg);
  FuncInfo::ReleaseTmpRegister(funcInfo,iteratorReg);
  Js::ByteCodeWriter::MarkLabel(this,labelID);
  return;
}

Assistant:

void EmitGetAsyncIterator(
    Js::RegSlot resultReg,
    Js::RegSlot iterableReg,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    auto* writer = byteCodeGenerator->Writer();

    Js::ByteCodeLabel noAsyncIterator = writer->DefineLabel();
    EmitGetOptionalObjectMethod(
        resultReg,
        iterableReg,
        Js::PropertyIds::_symbolAsyncIterator,
        noAsyncIterator,
        byteCodeGenerator,
        funcInfo);

    EmitFunctionCall(resultReg, resultReg, iterableReg, byteCodeGenerator, funcInfo);
    EmitThrowOnNotObject(resultReg, byteCodeGenerator);

    Js::ByteCodeLabel finished = writer->DefineLabel();
    writer->Br(finished);

    // Iterable does not have a Symbol.asyncIterator method: attempt to get a sync
    // iterable and wrap it with an AsyncFromSyncIterator
    writer->MarkLabel(noAsyncIterator);
    Js::RegSlot iteratorReg = funcInfo->AcquireTmpRegister();
    EmitGetIterator(iteratorReg, iterableReg, byteCodeGenerator, funcInfo);
    writer->Reg2(Js::OpCode::NewAsyncFromSyncIterator, iteratorReg, iteratorReg);
    writer->Reg2(Js::OpCode::Ld_A_ReuseLoc, resultReg, iteratorReg);    
    funcInfo->ReleaseTmpRegister(iteratorReg);
    byteCodeGenerator->Writer()->MarkLabel(finished);
}